

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O1

void Disa::level_expansion<Disa::Adjacency_Graph<false>>
               (Adjacency_Graph<false> *graph,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *seeds,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_color)

{
  source_location *psVar1;
  pointer puVar2;
  _Elt_pointer puVar3;
  pointer pcVar4;
  size_type sVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Elt_pointer puVar9;
  _Map_pointer ppuVar10;
  _Elt_pointer puVar11;
  _Elt_pointer puVar12;
  _Map_pointer ppuVar13;
  source_location *psVar14;
  pointer puVar15;
  __normal_iterator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  _Var16;
  long lVar17;
  unsigned_long *puVar18;
  ostream *poVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  source_location *psVar22;
  source_location *location;
  unsigned_long uVar23;
  unsigned_long *vertex;
  unsigned_long uVar24;
  ulong uVar25;
  __impl *__new_size;
  pointer pqVar26;
  pointer pqVar27;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  byte bVar28;
  span<const_unsigned_long,_18446744073709551615UL> sVar29;
  size_t front;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> new_queue;
  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  vertex_queues;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined *local_108;
  undefined8 uStack_100;
  Adjacency_Graph<false> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Elt_pointer local_c8;
  _Map_pointer ppuStack_c0;
  unsigned_long *local_b8;
  _Elt_pointer puStack_b0;
  _Elt_pointer local_a8;
  _Map_pointer ppuStack_a0;
  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_98;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  undefined **local_38;
  
  bVar28 = 0;
  uVar25 = (long)(graph->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(graph->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  local_f0 = graph;
  if ((uVar25 == 0) || (uVar25 < 9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_118 = &PTR_s__workspace_llm4binary_github_lic_00164600;
    console_format_abi_cxx11_(&local_e8,(Disa *)0x0,(Log_Level)&local_118,in_RCX);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Graph is empty.",0xf);
    std::endl<char,std::char_traits<char>>(poVar19);
  }
  else {
    psVar22 = (source_location *)
              (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    psVar1 = (source_location *)
             (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    psVar14 = psVar22;
    if (psVar22 == psVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_118 = &PTR_s__workspace_llm4binary_github_lic_00164618;
      console_format_abi_cxx11_(&local_e8,(Disa *)0x0,(Log_Level)&local_118,psVar22);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,local_e8._M_string_length
                          );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,"There are no seeds to begin expansion.",0x26);
      std::endl<char,std::char_traits<char>>(poVar19);
    }
    else {
      while (location = psVar14, psVar22 = psVar22 + 1, psVar22 != psVar1) {
        psVar14 = psVar22;
        if (psVar22->_M_impl <= location->_M_impl) {
          psVar14 = location;
        }
      }
      __new_size = (__impl *)(((long)uVar25 >> 3) + -1);
      if (location->_M_impl < __new_size) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (vertex_color,(size_type)__new_size);
        std::
        vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::vector(&local_98,
                 (long)(seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_e8);
        puVar15 = (vertex_color->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (vertex_color->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar15 != puVar2) {
          memset(puVar15,0xff,((long)puVar2 + (-8 - (long)puVar15) & 0xfffffffffffffff8U) + 8);
        }
        puVar15 = (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        if ((seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar15) {
          uVar23 = 0;
          do {
            puVar18 = local_98.
                      super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar23].c.
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (puVar18 ==
                local_98.
                super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23].c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_long,std::allocator<unsigned_long>>::
              _M_push_back_aux<unsigned_long_const&>
                        ((deque<unsigned_long,std::allocator<unsigned_long>> *)
                         (local_98.
                          super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar23),puVar15 + uVar23);
            }
            else {
              *puVar18 = puVar15[uVar23];
              *(unsigned_long **)
               ((deque<unsigned_long,std::allocator<unsigned_long>> *)
                (local_98.
                 super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23) + 0x30) = puVar18 + 1;
            }
            (vertex_color->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start
            [(seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar23]] = uVar23;
            uVar23 = uVar23 + 1;
            puVar15 = (seeds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar23 < (ulong)((long)(seeds->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar15 >> 3));
        }
        uVar23 = 0;
        do {
          pqVar27 = local_98.
                    super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          _Var16 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>*,std::vector<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>>>>,__gnu_cxx::__ops::_Iter_pred<Disa::level_expansion<Disa::Adjacency_Graph<false>>(Disa::Adjacency_Graph<false>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(auto:1_const&)_1_>>
                             (local_98.
                              super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_98.
                              super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          if (_Var16._M_current == pqVar27) {
            std::
            vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~vector(&local_98);
            return;
          }
          lVar17 = (long)local_98.
                         super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.
                         super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar24 = uVar23;
          if (lVar17 != 0) {
            uVar25 = 0;
            local_40 = uVar23;
            do {
              pqVar27 = (pointer)((long)&local_98.
                                         super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[~uVar25].c.
                                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Deque_impl_data._M_map + lVar17);
              if ((local_40 & 1) == 0) {
                pqVar27 = local_98.
                          super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar25;
              }
              local_a8 = (_Elt_pointer)0x0;
              ppuStack_a0 = (_Map_pointer)0x0;
              local_b8 = (unsigned_long *)0x0;
              puStack_b0 = (_Elt_pointer)0x0;
              local_c8 = (_Elt_pointer)0x0;
              ppuStack_c0 = (_Map_pointer)0x0;
              local_e8.field_2._M_allocated_capacity = 0;
              local_e8.field_2._8_8_ = (_Elt_pointer)0x0;
              local_e8._M_dataplus._M_p = (pointer)0x0;
              local_e8._M_string_length = 0;
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                        ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,0);
              while (ppuVar13 = ppuStack_a0, puVar12 = local_a8, puVar11 = puStack_b0,
                    puVar18 = local_b8, ppuVar10 = ppuStack_c0, puVar9 = local_c8,
                    uVar8 = local_e8.field_2._8_8_, uVar7 = local_e8.field_2._M_allocated_capacity,
                    sVar5 = local_e8._M_string_length, _Var6._M_p = local_e8._M_dataplus._M_p,
                    puVar3 = (pqVar27->c).
                             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur,
                    (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur != puVar3) {
                local_118 = (undefined **)*puVar3;
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&pqVar27->c);
                sVar29 = Adjacency_Graph<false>::operator[](local_f0,&local_118);
                puVar18 = sVar29._M_ptr;
                if (sVar29._M_extent._M_extent_value._M_extent_value != 0) {
                  lVar17 = sVar29._M_extent._M_extent_value._M_extent_value << 3;
                  do {
                    if ((vertex_color->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[*puVar18] == 0xffffffffffffffff) {
                      if (local_b8 == local_a8 + -1) {
                        std::deque<unsigned_long,std::allocator<unsigned_long>>::
                        _M_push_back_aux<unsigned_long_const&>
                                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,
                                   puVar18);
                      }
                      else {
                        *local_b8 = *puVar18;
                        local_b8 = local_b8 + 1;
                      }
                      puVar15 = (vertex_color->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      puVar15[*puVar18] = puVar15[(long)local_118];
                    }
                    puVar18 = puVar18 + 1;
                    lVar17 = lVar17 + -8;
                  } while (lVar17 != 0);
                }
              }
              local_118 = (undefined **)local_e8._M_dataplus._M_p;
              pcVar4 = (pointer)local_118;
              uStack_110 = local_e8._M_string_length;
              local_e8._M_dataplus._M_p = (char *)0x0;
              local_e8._M_string_length = 0;
              local_e8.field_2._M_allocated_capacity = 0;
              local_e8.field_2._8_8_ = 0;
              local_c8 = (_Elt_pointer)0x0;
              ppuStack_c0 = (_Map_pointer)0x0;
              local_b8 = (unsigned_long *)0x0;
              puStack_b0 = (_Elt_pointer)0x0;
              local_a8 = (_Elt_pointer)0x0;
              ppuStack_a0 = (_Map_pointer)0x0;
              pqVar26 = pqVar27;
              pbVar20 = &local_e8;
              for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pbVar20->_M_dataplus)._M_p =
                     (pointer)(pqVar26->c).
                              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Deque_impl_data._M_map;
                pqVar26 = (pointer)((long)pqVar26 + ((ulong)bVar28 * -2 + 1) * 8);
                pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)pbVar20 + (ulong)bVar28 * -0x10 + 8);
              }
              local_118._0_4_ = SUB84(_Var6._M_p,0);
              local_118._4_4_ = (undefined4)((ulong)_Var6._M_p >> 0x20);
              uStack_110._0_4_ = (undefined4)sVar5;
              uStack_110._4_4_ = (undefined4)(sVar5 >> 0x20);
              *(undefined4 *)
               &(pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_map = (undefined4)local_118;
              *(undefined4 *)
               ((long)&(pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Deque_impl_data._M_map + 4) = local_118._4_4_;
              *(undefined4 *)
               &(pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_map_size = (undefined4)uStack_110;
              *(undefined4 *)
               ((long)&(pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Deque_impl_data._M_map_size + 4) = uStack_110._4_4_;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)uVar7;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_first = (_Elt_pointer)uVar8;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_last = puVar9;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_node = ppuVar10;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar18;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first = puVar11;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last = puVar12;
              (pqVar27->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node = ppuVar13;
              local_118 = (undefined **)pcVar4;
              uStack_110 = sVar5;
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                        ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8);
              uVar25 = uVar25 + 1;
              lVar17 = (long)local_98.
                             super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.
                             super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar24 = local_40;
            } while (uVar25 < (ulong)((lVar17 >> 4) * -0x3333333333333333));
          }
          uVar23 = uVar24 + 1;
          psVar22 = (source_location *)
                    (local_f0->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar17 = (long)(local_f0->offset).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)psVar22;
        } while ((lVar17 != 0) && (uVar24 < (lVar17 >> 3) - 1U));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_38 = &PTR_s__workspace_llm4binary_github_lic_00164648;
        console_format_abi_cxx11_(&local_e8,(Disa *)0x0,(Log_Level)&local_38,psVar22);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,
                             local_e8._M_string_length);
        std::__cxx11::to_string(&local_80,uVar23);
        std::operator+(&local_60,"Number of iterations have exceeded, ",&local_80);
        pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_60,". Is the graph disjoint?");
        local_118 = (undefined **)(pbVar20->_M_dataplus)._M_p;
        paVar21 = &pbVar20->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118 == paVar21) {
          local_108 = (undefined *)paVar21->_M_allocated_capacity;
          uStack_100 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
          local_118 = &local_108;
        }
        else {
          local_108 = (undefined *)paVar21->_M_allocated_capacity;
        }
        uStack_110 = pbVar20->_M_string_length;
        (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar20->_M_string_length = 0;
        (pbVar20->field_2)._M_local_buf[0] = '\0';
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_118,uStack_110);
        std::endl<char,std::char_traits<char>>(poVar19);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_98.
        super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&PTR_s__workspace_llm4binary_github_lic_00164630;
        console_format_abi_cxx11_(&local_e8,(Disa *)0x0,(Log_Level)&local_98,location);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,
                             local_e8._M_string_length);
        puVar15 = (local_f0->offset).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar2 = (local_f0->offset).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = 0;
        if (puVar15 != puVar2) {
          uVar23 = ((long)puVar15 - (long)puVar2 >> 3) - 1;
        }
        std::__cxx11::to_string(&local_80,uVar23);
        std::operator+(&local_60,"A seed index is not in graph range [0, ",&local_80);
        pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_60,").");
        local_118 = (undefined **)(pbVar20->_M_dataplus)._M_p;
        paVar21 = &pbVar20->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118 == paVar21) {
          local_108 = (undefined *)paVar21->_M_allocated_capacity;
          uStack_100 = *(undefined8 *)((long)&pbVar20->field_2 + 8);
          local_118 = &local_108;
        }
        else {
          local_108 = (undefined *)paVar21->_M_allocated_capacity;
        }
        uStack_110 = pbVar20->_M_string_length;
        (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar20->_M_string_length = 0;
        (pbVar20->field_2)._M_local_buf[0] = '\0';
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_118,uStack_110);
        std::endl<char,std::char_traits<char>>(poVar19);
      }
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  std::__cxx11::string::~string((string *)&local_e8);
  exit(1);
}

Assistant:

void level_expansion(const _graph& graph, const std::vector<std::size_t>& seeds,
                     std::vector<std::size_t>& vertex_color) {
  ASSERT_DEBUG(!graph.empty(), "Graph is empty.");
  ASSERT_DEBUG(!seeds.empty(), "There are no seeds to begin expansion.");
  ASSERT_DEBUG(*std::max_element(seeds.begin(), seeds.end()) < graph.size_vertex(),
               "A seed index is not in graph range [0, " + std::to_string(graph.size_vertex()) + ").");

  // Setup memory, and seed the queues and colors.
  vertex_color.resize(graph.size_vertex());
  std::vector<std::queue<std::size_t>> vertex_queues(seeds.size());
  FOR_EACH_REF(color, vertex_color) color = std::numeric_limits<std::size_t>::max();
  FOR(i_seed, seeds.size()) {
    vertex_queues[i_seed].push({seeds[i_seed]});
    vertex_color[seeds[i_seed]] = i_seed;
  }

  // Color vertices.
  std::size_t iteration = 0;
  while(std::any_of(vertex_queues.begin(), vertex_queues.end(), [](const auto& queue) { return !queue.empty(); })) {
    FOR(i_queue, vertex_queues.size()) {
      // ensures we do a forward's and backwards sweep to try and keep expansion 'unbiased'.
      auto& vertex_queue =
      iteration % 2 == 0 ? vertex_queues[i_queue] : vertex_queues[vertex_queues.size() - i_queue - 1];

      // Perform a level expansion for this color.
      std::queue<std::size_t> new_queue;
      while(!vertex_queue.empty()) {
        const std::size_t front = vertex_queue.front();
        vertex_queue.pop();
        FOR_EACH(vertex, graph[front]) {
          if(vertex_color[vertex] == std::numeric_limits<std::size_t>::max()) {
            new_queue.push(vertex);
            vertex_color[vertex] = vertex_color[front];
          }
        }
      }
      std::swap(new_queue, vertex_queue);
    }
    ASSERT(iteration++ < graph.size_vertex(),
           "Number of iterations have exceeded, " + std::to_string(iteration) + ". Is the graph disjoint?");
  }
}